

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::CutpoolPropagation::cutAdded(CutpoolPropagation *this,HighsInt cut,bool propagate)

{
  byte *pbVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  HighsCutPool *pHVar4;
  pointer ppVar5;
  double *ARvalue;
  HighsInt *pHVar6;
  undefined7 in_register_00000011;
  pointer ARvalue_00;
  size_type sVar7;
  value_type_conflict5 local_42 [2];
  HighsInt *local_40;
  pointer local_38;
  
  if ((int)CONCAT71(in_register_00000011,propagate) == 0) {
    if (this->domain ==
        &((this->domain->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain) {
      pHVar4 = this->cutpool;
      ppVar5 = (pHVar4->matrix_).ARrange_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar6 = (pHVar4->matrix_).ARindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      HVar2 = ppVar5[cut].first;
      HVar3 = *(int *)((long)(ppVar5 + cut) + 4);
      ARvalue = (pHVar4->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->activitycuts_).
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->activitycuts_).
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 4) <= cut) {
        sVar7 = (size_type)(cut + 1);
        local_40 = pHVar6;
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->activitycuts_,sVar7)
        ;
        std::vector<int,_std::allocator<int>_>::resize(&this->activitycutsinf_,sVar7);
        local_42[1] = 2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->propagatecutflags_,sVar7,local_42 + 1);
        std::vector<double,_std::allocator<double>_>::resize(&this->capacityThreshold_,sVar7);
        pHVar6 = local_40;
      }
      pbVar1 = (this->propagatecutflags_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + cut;
      *pbVar1 = *pbVar1 & 0xfd;
      computeMinActivity(this->domain,HVar2,HVar3,pHVar6,ARvalue,
                         (this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start + cut,
                         (this->activitycuts_).
                         super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                         super__Vector_impl_data._M_start + cut);
    }
  }
  else {
    pHVar4 = this->cutpool;
    ppVar5 = (pHVar4->matrix_).ARrange_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar6 = (pHVar4->matrix_).ARindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar2 = ppVar5[cut].first;
    HVar3 = *(int *)((long)(ppVar5 + cut) + 4);
    ARvalue_00 = (pHVar4->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->activitycuts_).
                            super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->activitycuts_).
                           super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 4) <= cut) {
      sVar7 = (size_type)(cut + 1);
      local_40 = pHVar6;
      local_38 = ARvalue_00;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->activitycuts_,sVar7);
      std::vector<int,_std::allocator<int>_>::resize(&this->activitycutsinf_,sVar7);
      local_42[0] = '\x02';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->propagatecutflags_,sVar7,local_42);
      std::vector<double,_std::allocator<double>_>::resize(&this->capacityThreshold_,sVar7);
      pHVar6 = local_40;
      ARvalue_00 = local_38;
    }
    pbVar1 = (this->propagatecutflags_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + cut;
    *pbVar1 = *pbVar1 & 0xfd;
    computeMinActivity(this->domain,HVar2,HVar3,pHVar6,ARvalue_00,
                       (this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + cut,
                       (this->activitycuts_).
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start + cut);
    recomputeCapacityThreshold(this,cut);
    markPropagateCut(this,cut);
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::cutAdded(HighsInt cut, bool propagate) {
  if (!propagate) {
    if (domain != &domain->mipsolver->mipdata_->domain) return;
    HighsInt start = cutpool->getMatrix().getRowStart(cut);
    HighsInt end = cutpool->getMatrix().getRowEnd(cut);
    const HighsInt* arindex = cutpool->getMatrix().getARindex();
    const double* arvalue = cutpool->getMatrix().getARvalue();

    if (HighsInt(activitycuts_.size()) <= cut) {
      activitycuts_.resize(cut + 1);
      activitycutsinf_.resize(cut + 1);
      propagatecutflags_.resize(cut + 1, 2);
      capacityThreshold_.resize(cut + 1);
    }

    propagatecutflags_[cut] &= ~uint8_t{2};
    domain->computeMinActivity(start, end, arindex, arvalue,
                               activitycutsinf_[cut], activitycuts_[cut]);
  } else {
    HighsInt start = cutpool->getMatrix().getRowStart(cut);
    HighsInt end = cutpool->getMatrix().getRowEnd(cut);
    const HighsInt* arindex = cutpool->getMatrix().getARindex();
    const double* arvalue = cutpool->getMatrix().getARvalue();

    if (HighsInt(activitycuts_.size()) <= cut) {
      activitycuts_.resize(cut + 1);
      activitycutsinf_.resize(cut + 1);
      propagatecutflags_.resize(cut + 1, 2);
      capacityThreshold_.resize(cut + 1);
    }

    propagatecutflags_[cut] &= ~uint8_t{2};
    domain->computeMinActivity(start, end, arindex, arvalue,
                               activitycutsinf_[cut], activitycuts_[cut]);

    recomputeCapacityThreshold(cut);
    markPropagateCut(cut);
  }
}